

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTf.cpp
# Opt level: O0

void __thiscall OpenMD::NPTf::scaleSimBox(NPTf *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double *pdVar9;
  long in_RDI;
  Mat3x3d hmat;
  Mat3x3d hmnew;
  Mat3x3d hm;
  RealType offDiagMax;
  RealType smallScale;
  RealType bigScale;
  RealType eta2ij;
  Mat3x3d scaleMat;
  int k;
  int j;
  int i;
  Snapshot *in_stack_fffffffffffffb28;
  SquareMatrix3<double> *in_stack_fffffffffffffb30;
  SquareMatrix3<double> *in_stack_fffffffffffffb60;
  SquareMatrix3<double> *in_stack_fffffffffffffb68;
  Mat3x3d *in_stack_fffffffffffffbb8;
  Snapshot *in_stack_fffffffffffffbc0;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  RectMatrix<double,_3U,_3U> local_60;
  uint local_14;
  uint local_10;
  uint local_c;
  
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x216d3c);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x216d49);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x216d58);
  local_70 = 1.0;
  local_78 = 1.0;
  local_80 = 0.0;
  for (local_c = 0; (int)local_c < 3; local_c = local_c + 1) {
    for (local_10 = 0; (int)local_10 < 3; local_10 = local_10 + 1) {
      local_68 = 0.0;
      for (local_14 = 0; (int)local_14 < 3; local_14 = local_14 + 1) {
        pdVar9 = RectMatrix<double,_3U,_3U>::operator()
                           ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),local_c,local_14);
        dVar1 = *pdVar9;
        pdVar9 = RectMatrix<double,_3U,_3U>::operator()
                           ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),local_14,local_10);
        local_68 = dVar1 * *pdVar9 + local_68;
      }
      pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,local_c,local_10);
      *pdVar9 = 0.0;
      if (local_c == local_10) {
        pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,local_c,local_10);
        *pdVar9 = 1.0;
      }
      dVar1 = *(double *)(in_RDI + 8);
      pdVar9 = RectMatrix<double,_3U,_3U>::operator()
                         ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),local_c,local_10);
      dVar2 = *pdVar9;
      dVar3 = *(double *)(in_RDI + 8);
      pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,local_c,local_10);
      *pdVar9 = dVar1 * dVar2 + dVar3 * 0.5 * dVar3 * local_68 + *pdVar9;
      if ((local_c != local_10) &&
         (pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,local_c,local_10),
         local_80 < ABS(*pdVar9))) {
        pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,local_c,local_10);
        local_80 = ABS(*pdVar9);
      }
    }
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,local_c,local_c);
    if (local_70 < *pdVar9) {
      pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,local_c,local_c);
      local_70 = *pdVar9;
    }
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,local_c,local_c);
    if (*pdVar9 < local_78) {
      pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,local_c,local_c);
      local_78 = *pdVar9;
    }
  }
  if ((1.01 < local_70) || (local_78 < 0.99)) {
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,0,0);
    dVar1 = *pdVar9;
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,0,1);
    dVar2 = *pdVar9;
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,0,2);
    dVar3 = *pdVar9;
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,1,0);
    dVar4 = *pdVar9;
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,1,1);
    dVar5 = *pdVar9;
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,1,2);
    dVar6 = *pdVar9;
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,2,0);
    dVar7 = *pdVar9;
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,2,1);
    dVar8 = *pdVar9;
    RectMatrix<double,_3U,_3U>::operator()(&local_60,2,2);
    RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),0,0);
    RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),0,1);
    RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),0,2);
    RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),1,0);
    RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),1,1);
    RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),1,2);
    RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),2,0);
    RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),2,1);
    RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),2,2);
    snprintf(painCave.errMsg,2000,
             "NPTf error: Attempting a Box scaling of more than 1 percent.\n Check your tauBarostat, as it is probably too small!\n\n scaleMat = [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n      eta = [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n"
             ,dVar1,SUB84(dVar2,0),dVar3,dVar4,dVar5,dVar6,dVar7,dVar8);
    painCave.isFatal = 1;
    simError();
  }
  else if (local_80 <= 0.01) {
    Snapshot::getHmat(in_stack_fffffffffffffb28);
    OpenMD::operator*(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
    SquareMatrix3<double>::operator=
              (in_stack_fffffffffffffb30,(SquareMatrix3<double> *)in_stack_fffffffffffffb28);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x217c4f);
    Snapshot::setHmat(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x217c7a);
  }
  else {
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,0,0);
    dVar1 = *pdVar9;
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,0,1);
    dVar2 = *pdVar9;
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,0,2);
    dVar3 = *pdVar9;
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,1,0);
    dVar4 = *pdVar9;
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,1,1);
    dVar5 = *pdVar9;
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,1,2);
    dVar6 = *pdVar9;
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,2,0);
    dVar7 = *pdVar9;
    pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_60,2,1);
    dVar8 = *pdVar9;
    RectMatrix<double,_3U,_3U>::operator()(&local_60,2,2);
    RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),0,0);
    RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),0,1);
    RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),0,2);
    RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),1,0);
    RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),1,1);
    RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),1,2);
    RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),2,0);
    RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),2,1);
    RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),2,2);
    snprintf(painCave.errMsg,2000,
             "NPTf error: Attempting an off-diagonal Box scaling of more than 1 percent.\n Check your tauBarostat, as it is probably too small!\n\n scaleMat = [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n      eta = [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n"
             ,dVar1,SUB84(dVar2,0),dVar3,dVar4,dVar5,dVar6,dVar7,dVar8);
    painCave.isFatal = 1;
    simError();
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x217cd1);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x217cde);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x217ceb);
  return;
}

Assistant:

void NPTf::scaleSimBox() {
    int i;
    int j;
    int k;
    Mat3x3d scaleMat;
    RealType eta2ij;
    RealType bigScale, smallScale, offDiagMax;
    Mat3x3d hm;
    Mat3x3d hmnew;

    // Scale the box after all the positions have been moved:

    // Use a taylor expansion for eta products:  Hmat = Hmat . exp(dt * etaMat)
    //  Hmat = Hmat . ( Ident + dt * etaMat  + dt^2 * etaMat*etaMat / 2)

    bigScale   = 1.0;
    smallScale = 1.0;
    offDiagMax = 0.0;

    for (i = 0; i < 3; i++) {
      for (j = 0; j < 3; j++) {
        // Calculate the matrix Product of the eta array (we only need
        // the ij element right now):

        eta2ij = 0.0;
        for (k = 0; k < 3; k++) {
          eta2ij += eta(i, k) * eta(k, j);
        }

        scaleMat(i, j) = 0.0;
        // identity matrix (see above):
        if (i == j) scaleMat(i, j) = 1.0;
        // Taylor expansion for the exponential truncated at second order:
        scaleMat(i, j) += dt * eta(i, j) + 0.5 * dt * dt * eta2ij;

        if (i != j)
          if (fabs(scaleMat(i, j)) > offDiagMax)
            offDiagMax = fabs(scaleMat(i, j));
      }

      if (scaleMat(i, i) > bigScale) bigScale = scaleMat(i, i);
      if (scaleMat(i, i) < smallScale) smallScale = scaleMat(i, i);
    }

    if ((bigScale > 1.01) || (smallScale < 0.99)) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "NPTf error: Attempting a Box scaling of more than 1 percent.\n"
               " Check your tauBarostat, as it is probably too small!\n\n"
               " scaleMat = [%lf\t%lf\t%lf]\n"
               "            [%lf\t%lf\t%lf]\n"
               "            [%lf\t%lf\t%lf]\n"
               "      eta = [%lf\t%lf\t%lf]\n"
               "            [%lf\t%lf\t%lf]\n"
               "            [%lf\t%lf\t%lf]\n",
               scaleMat(0, 0), scaleMat(0, 1), scaleMat(0, 2), scaleMat(1, 0),
               scaleMat(1, 1), scaleMat(1, 2), scaleMat(2, 0), scaleMat(2, 1),
               scaleMat(2, 2), eta(0, 0), eta(0, 1), eta(0, 2), eta(1, 0),
               eta(1, 1), eta(1, 2), eta(2, 0), eta(2, 1), eta(2, 2));
      painCave.isFatal = 1;
      simError();
    } else if (offDiagMax > 0.01) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "NPTf error: Attempting an off-diagonal Box scaling of more than 1 "
          "percent.\n"
          " Check your tauBarostat, as it is probably too small!\n\n"
          " scaleMat = [%lf\t%lf\t%lf]\n"
          "            [%lf\t%lf\t%lf]\n"
          "            [%lf\t%lf\t%lf]\n"
          "      eta = [%lf\t%lf\t%lf]\n"
          "            [%lf\t%lf\t%lf]\n"
          "            [%lf\t%lf\t%lf]\n",
          scaleMat(0, 0), scaleMat(0, 1), scaleMat(0, 2), scaleMat(1, 0),
          scaleMat(1, 1), scaleMat(1, 2), scaleMat(2, 0), scaleMat(2, 1),
          scaleMat(2, 2), eta(0, 0), eta(0, 1), eta(0, 2), eta(1, 0), eta(1, 1),
          eta(1, 2), eta(2, 0), eta(2, 1), eta(2, 2));
      painCave.isFatal = 1;
      simError();
    } else {
      Mat3x3d hmat = snap->getHmat();
      hmat         = hmat * scaleMat;
      snap->setHmat(hmat);
    }
  }